

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::BoxStackInstance
              (Var instance,ScriptContext *scriptContext,bool allowStackFunction,bool deepCopy)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *this;
  JavascriptNativeIntArray *pJVar6;
  JavascriptArray *pJVar7;
  DynamicObject *pDVar8;
  JavascriptRegExp *pJVar9;
  JavascriptNativeFloatArray *pJVar10;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  
  bVar3 = ThreadContext::IsOnStack(instance);
  if (!bVar3) {
    return instance;
  }
  if ((allowStackFunction) && (bVar3 = VarIs<Js::RecyclableObject>(instance), bVar3)) {
    if ((*instance & 1) != 0) {
      return instance;
    }
LAB_00abeb20:
    if (((ulong)instance & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)instance & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)instance >> 0x32 != 0 || ((ulong)instance & 0xffff000000000000) == 0x1000000000000)
      {
        return instance;
      }
      goto LAB_00abec0b;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
  }
  else {
    if (instance != (Var)0x0) goto LAB_00abeb20;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00abeebb;
    *puVar5 = 0;
LAB_00abec0b:
    this = UnsafeVarTo<Js::RecyclableObject>(instance);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00abeebb;
      *puVar5 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar1) && (BVar4 = RecyclableObject::IsExternal(this), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_00abeebb;
      *puVar5 = 0;
    }
    switch(TVar1) {
    case TypeIds_Function:
      if (allowStackFunction) {
        return instance;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
      ;
      error = "(allowStackFunction)";
      message = "allowStackFunction";
      lineNumber = 0x289f;
      goto LAB_00abee99;
    case TypeIds_Object:
      pDVar8 = VarTo<Js::DynamicObject>(instance);
      pDVar8 = DynamicObject::BoxStackInstance(pDVar8,deepCopy);
      return pDVar8;
    case TypeIds_Array:
      pJVar7 = UnsafeVarTo<Js::JavascriptArray>(instance);
      pJVar7 = JavascriptArray::BoxStackInstance(pJVar7,deepCopy);
      return pJVar7;
    case TypeIds_NativeIntArray:
      pJVar6 = UnsafeVarTo<Js::JavascriptNativeIntArray>(instance);
      pJVar6 = JavascriptNativeIntArray::BoxStackInstance(pJVar6,deepCopy);
      return pJVar6;
    case TypeIds_CopyOnAccessNativeIntArray:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x28a5,"(false)","false");
      if (!bVar3) goto LAB_00abeebb;
      *puVar5 = 0;
      break;
    case TypeIds_ArrayLast:
      pJVar10 = UnsafeVarTo<Js::JavascriptNativeFloatArray>(instance);
      pJVar10 = JavascriptNativeFloatArray::BoxStackInstance(pJVar10,deepCopy);
      return pJVar10;
    case TypeIds_RegEx:
      pJVar9 = VarTo<Js::JavascriptRegExp>(instance);
      pJVar9 = JavascriptRegExp::BoxStackInstance(pJVar9,deepCopy);
      return pJVar9;
    default:
      if (TVar1 - TypeIds_FirstNumberType < 2) {
        return instance;
      }
    case TypeIds_ArrayLastWithES5:
    case TypeIds_Date:
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar5 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
    ;
    error = "(false)";
    message = "false";
    lineNumber = 0x28a9;
  }
LAB_00abee99:
  bVar3 = Throw::ReportAssert(fileName,lineNumber,error,message);
  if (bVar3) {
    *puVar5 = 0;
    return instance;
  }
LAB_00abeebb:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

Js::Var
    JavascriptOperators::BoxStackInstance(Js::Var instance, ScriptContext * scriptContext, bool allowStackFunction, bool deepCopy)
    {
        if (!ThreadContext::IsOnStack(instance) || (allowStackFunction && !TaggedNumber::Is(instance) && (*(int*)instance & 1)))
        {
            return instance;
        }

        TypeId typeId = JavascriptOperators::GetTypeId(instance);
        switch (typeId)
        {
        case Js::TypeIds_Number:
#if !FLOATVAR
            return JavascriptNumber::BoxStackInstance(instance, scriptContext);
#endif
            // fall-through
        case Js::TypeIds_Integer:
            return instance;
        case Js::TypeIds_RegEx:
            return JavascriptRegExp::BoxStackInstance(VarTo<JavascriptRegExp>(instance), deepCopy);
        case Js::TypeIds_Object:
            return DynamicObject::BoxStackInstance(VarTo<DynamicObject>(instance), deepCopy);
        case Js::TypeIds_Array:
            return JavascriptArray::BoxStackInstance(UnsafeVarTo<JavascriptArray>(instance), deepCopy);
        case Js::TypeIds_NativeIntArray:
            return JavascriptNativeIntArray::BoxStackInstance(UnsafeVarTo<JavascriptNativeIntArray>(instance), deepCopy);
        case Js::TypeIds_NativeFloatArray:
            return JavascriptNativeFloatArray::BoxStackInstance(UnsafeVarTo<JavascriptNativeFloatArray>(instance), deepCopy);
        case Js::TypeIds_Function:
            Assert(allowStackFunction);
            // Stack functions are deal with not mar mark them, but by nested function escape analysis
            // in the front end.  No need to box here.
            return instance;
#if ENABLE_COPYONACCESS_ARRAY
        case Js::TypeIds_CopyOnAccessNativeIntArray:
            Assert(false);
            // fall-through
#endif
        default:
            Assert(false);
            return instance;
        };
    }